

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::(anonymous_namespace)::immutable_item_comparator::operator()
          (void *this,
          pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>
          *lhs,pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>
               *rhs)

{
  int iVar1;
  int iVar2;
  int r_distance;
  int l_distance;
  pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>
  *rhs_local;
  pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>
  *lhs_local;
  immutable_item_comparator *this_local;
  
  iVar1 = min_distance_exp(&lhs->first,*this);
  iVar2 = min_distance_exp(&rhs->first,*this);
  return (lhs->second).num_announcers / 5 - iVar1 < (rhs->second).num_announcers / 5 - iVar2;
}

Assistant:

bool operator()(std::pair<node_id const, Item> const& lhs
			, std::pair<node_id const, Item> const& rhs) const
		{
			int const l_distance = min_distance_exp(lhs.first, m_node_ids);
			int const r_distance = min_distance_exp(rhs.first, m_node_ids);

			// this is a score taking the popularity (number of announcers) and the
			// fit, in terms of distance from ideal storing node, into account.
			// each additional 5 announcers is worth one extra bit in the distance.
			// that is, an item with 10 announcers is allowed to be twice as far
			// from another item with 5 announcers, from our node ID. Twice as far
			// because it gets one more bit.
			return lhs.second.num_announcers / 5 - l_distance < rhs.second.num_announcers / 5 - r_distance;
		}